

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commands.cpp
# Opt level: O0

char __thiscall libchars::command_cursor::current_char(command_cursor *this)

{
  value_type pcVar1;
  ulong uVar2;
  bool bVar3;
  const_reference ppcVar4;
  ulong uVar5;
  char *pcVar6;
  command_node *n;
  command_cursor *this_local;
  
  bVar3 = std::
          stack<libchars::command_node_*,_std::deque<libchars::command_node_*,_std::allocator<libchars::command_node_*>_>_>
          ::empty(&this->S);
  if (bVar3) {
    if ((this->root != (command_node *)0x0) &&
       (uVar2 = this->root_idx, uVar5 = std::__cxx11::string::length(), uVar2 < uVar5)) {
      pcVar6 = (char *)std::__cxx11::string::at((ulong)this->root);
      return *pcVar6;
    }
  }
  else {
    ppcVar4 = std::
              stack<libchars::command_node_*,_std::deque<libchars::command_node_*,_std::allocator<libchars::command_node_*>_>_>
              ::top(&this->S);
    pcVar1 = *ppcVar4;
    if ((pcVar1 != (value_type)0x0) &&
       (uVar2 = this->idx, uVar5 = std::__cxx11::string::length(), uVar2 < uVar5)) {
      pcVar6 = (char *)std::__cxx11::string::at((ulong)pcVar1);
      return *pcVar6;
    }
  }
  return '\0';
}

Assistant:

char command_cursor::current_char() const
    {
        if (S.empty()) {
            if (root != NULL && root_idx < root->part.length())
                return root->part.at(root_idx + idx);
        }
        else {
            command_node *n = S.top();
            if (n != NULL && idx < n->part.length())
                return n->part.at(idx);
        }
        return 0;
    }